

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

string * __thiscall
pbrt::syntactic::ParamArray<int>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<int> *this)

{
  ostream *poVar1;
  pointer piVar2;
  ulong uVar3;
  stringstream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  (**(this->super_Param)._vptr_Param)(&local_1d0,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"[ ",2);
  piVar2 = (this->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish != piVar2) {
    uVar3 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,piVar2[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar3 = uVar3 + 1;
      piVar2 = (this->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar3 < (ulong)((long)(this->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<int>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }